

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O3

bool mxx::impl::
     is_sorted<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
               (int *begin,int *end,comm *param_3)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  bool bVar5;
  int result;
  int i;
  int local_30;
  uint local_2c;
  
  piVar4 = begin;
  if (begin != end) {
    piVar1 = begin + 1;
    do {
      piVar3 = piVar1;
      piVar4 = end;
      if (piVar3 == end) break;
      piVar1 = piVar3 + 1;
      piVar4 = piVar3;
    } while (piVar3[-1] <= *piVar3);
  }
  bVar5 = piVar4 == end;
  if (param_3->m_size != 1) {
    iVar2 = right_shift<int>(end + -1,param_3);
    bVar5 = param_3->m_rank < 1 && piVar4 == end;
    if ((0 < param_3->m_rank) && (piVar4 == end)) {
      bVar5 = iVar2 <= *begin;
    }
    local_2c = (uint)bVar5;
    MPI_Allreduce(&local_2c,&local_30,1,&ompi_mpi_int,&ompi_mpi_op_land,param_3->mpi_comm);
    bVar5 = local_30 != 0;
  }
  return bVar5;
}

Assistant:

bool is_sorted(_Iterator begin, _Iterator end, _Compare comp, const mxx::comm& comm)
{
    // get value type of underlying data
    typedef typename std::iterator_traits<_Iterator>::value_type value_type;

    // check that it is locally sorted (int for MPI_Reduction)
    bool sorted = std::is_sorted(begin, end, comp);

    // if single process, this is it
    if (comm.size() == 1)
        return sorted;

    // compare if last element on left processor is not bigger than first
    // element on mine
    value_type left_el = mxx::right_shift(*(end-1), comm);

    // check if sorted with respect to neighbors
    if (comm.rank() > 0) {
        sorted = sorted && !comp(*begin, left_el);
    }

    // now check that this condition is true for all processes
    return mxx::all_of(sorted, comm);
}